

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

char * off_bit_name(long *off_flags)

{
  char *pcVar1;
  size_t sVar2;
  
  off_bit_name::buf[0] = '\0';
  if ((*off_flags & 1) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," area_at",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 5,"_attack",8);
  }
  if ((*off_flags & 2) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," backsta",8);
    (off_bit_name::buf + sVar2 + 8)[0] = 'b';
    (off_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*off_flags & 4) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," bas",4);
    (off_bit_name::buf + sVar2 + 4)[0] = 'h';
    (off_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*off_flags & 8) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," berserk",8);
    off_bit_name::buf[sVar2 + 8] = '\0';
  }
  if ((*off_flags & 0x10) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," disarm",8);
  }
  if ((*off_flags & 0x20) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," dod",4);
    builtin_strncpy(off_bit_name::buf + sVar2 + 3,"dge",4);
  }
  if ((*off_flags & 0x40) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," fad",4);
    (off_bit_name::buf + sVar2 + 4)[0] = 'e';
    (off_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*off_flags & 0x80) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," fas",4);
    (off_bit_name::buf + sVar2 + 4)[0] = 't';
    (off_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*off_flags & 0x100) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," kic",4);
    (off_bit_name::buf + sVar2 + 4)[0] = 'k';
    (off_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*off_flags & 0x200) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," kick_di",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 7,"irt",4);
  }
  if ((*off_flags & 0x400) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," par",4);
    builtin_strncpy(off_bit_name::buf + sVar2 + 3,"rry",4);
  }
  if ((*off_flags & 0x1000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," tai",4);
    (off_bit_name::buf + sVar2 + 4)[0] = 'l';
    (off_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*off_flags & 0x2000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," tri",4);
    (off_bit_name::buf + sVar2 + 4)[0] = 'p';
    (off_bit_name::buf + sVar2 + 4)[1] = '\0';
  }
  if ((*off_flags & 0x4000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," cru",4);
    builtin_strncpy(off_bit_name::buf + sVar2 + 3,"ush",4);
  }
  if ((*off_flags & 0x8000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 8,"all",4);
  }
  if ((*off_flags & 0x10000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 6,"t_align",8);
  }
  if ((*off_flags & 0x20000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 5,"st_race",8);
  }
  if ((*off_flags & 0x40000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 8,"players",8);
  }
  if ((*off_flags & 0x80000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 6,"t_guard",8);
  }
  if ((*off_flags & 0x100000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 5,"st_vnum",8);
  }
  if ((*off_flags & 0x200000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," no_trac",8);
    (off_bit_name::buf + sVar2 + 8)[0] = 'k';
    (off_bit_name::buf + sVar2 + 8)[1] = '\0';
  }
  if ((*off_flags & 0x400000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," static_",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 6,"c_track",8);
  }
  if ((*off_flags & 0x800000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," spam_mu",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 5,"_murder",8);
  }
  if ((*off_flags & 0x4000000) != 0) {
    sVar2 = strlen(off_bit_name::buf);
    builtin_strncpy(off_bit_name::buf + sVar2," assist_",8);
    builtin_strncpy(off_bit_name::buf + sVar2 + 6,"t_group",8);
  }
  pcVar1 = off_bit_name::buf;
  if (off_bit_name::buf[0] == '\0') {
    pcVar1 = " none";
  }
  return pcVar1 + 1;
}

Assistant:

char *off_bit_name(long off_flags[])
{
	static char buf[512];

	buf[0] = '\0';

	if (IS_SET(off_flags, OFF_AREA_ATTACK))
		strcat(buf, " area_attack");

	if (IS_SET(off_flags, OFF_BACKSTAB))
		strcat(buf, " backstab");

	if (IS_SET(off_flags, OFF_BASH))
		strcat(buf, " bash");

	if (IS_SET(off_flags, OFF_BERSERK))
		strcat(buf, " berserk");

	if (IS_SET(off_flags, OFF_DISARM))
		strcat(buf, " disarm");

	if (IS_SET(off_flags, OFF_DODGE))
		strcat(buf, " dodge");

	if (IS_SET(off_flags, OFF_FADE))
		strcat(buf, " fade");

	if (IS_SET(off_flags, OFF_FAST))
		strcat(buf, " fast");

	if (IS_SET(off_flags, OFF_KICK))
		strcat(buf, " kick");

	if (IS_SET(off_flags, OFF_KICK_DIRT))
		strcat(buf, " kick_dirt");

	if (IS_SET(off_flags, OFF_PARRY))
		strcat(buf, " parry");

	if (IS_SET(off_flags, OFF_TAIL))
		strcat(buf, " tail");

	if (IS_SET(off_flags, OFF_TRIP))
		strcat(buf, " trip");

	if (IS_SET(off_flags, OFF_CRUSH))
		strcat(buf, " crush");

	if (IS_SET(off_flags, ASSIST_ALL))
		strcat(buf, " assist_all");

	if (IS_SET(off_flags, ASSIST_ALIGN))
		strcat(buf, " assist_align");

	if (IS_SET(off_flags, ASSIST_RACE))
		strcat(buf, " assist_race");

	if (IS_SET(off_flags, ASSIST_PLAYERS))
		strcat(buf, " assist_players");

	if (IS_SET(off_flags, ASSIST_GUARD))
		strcat(buf, " assist_guard");

	if (IS_SET(off_flags, ASSIST_VNUM))
		strcat(buf, " assist_vnum");

	if (IS_SET(off_flags, NO_TRACK))
		strcat(buf, " no_track");

	if (IS_SET(off_flags, STATIC_TRACKING))
		strcat(buf, " static_track");

	if (IS_SET(off_flags, SPAM_MURDER))
		strcat(buf, " spam_murder");

	if (IS_SET(off_flags, ASSIST_GROUP))
		strcat(buf, " assist_group");

	return (buf[0] != '\0') ? buf + 1 : (char *)"none";
}